

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionals.c
# Opt level: O2

void xc_func_nullify(xc_func_type *func)

{
  func->info = (xc_func_info_type *)0x0;
  func->nspin = 1;
  *(undefined8 *)&func->n_func_aux = 0;
  *(undefined8 *)((long)&func->func_aux + 4) = 0;
  *(undefined8 *)((long)&func->mix_coef + 4) = 0;
  *(undefined8 *)((long)&func->cam_omega + 4) = 0;
  *(undefined8 *)((long)&func->cam_alpha + 4) = 0;
  *(undefined8 *)((long)&func->cam_beta + 4) = 0;
  func->nlc_b = 0.0;
  func->nlc_C = 0.0;
  func->ext_params = (double *)0x0;
  func->params = (void *)0x0;
  func->dens_threshold = 0.0;
  func->zeta_threshold = 0.0;
  func->sigma_threshold = 0.0;
  func->tau_threshold = 0.0;
  return;
}

Assistant:

void xc_func_nullify(xc_func_type *func)
{
  assert(func != NULL);

  func->info       = NULL;
  func->nspin      = XC_UNPOLARIZED;

  func->n_func_aux = 0;
  func->func_aux   = NULL;
  func->mix_coef   = NULL;

  func->cam_omega  = 0.0;
  func->cam_alpha  = 0.0;
  func->cam_beta   = 0.0;

  func->nlc_b = func->nlc_C = 0.0;

  func->ext_params = NULL;
  func->params     = NULL;

  func->dens_threshold  = 0.0;
  func->zeta_threshold  = 0.0;
  func->sigma_threshold = 0.0;
  func->tau_threshold   = 0.0;
}